

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<kj::AppendableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryAppendFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  Disposer DVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  AppendableFile *pAVar5;
  AppendableFile *extraout_RDX;
  _func_int **pp_Var6;
  AppendableFile *extraout_RDX_00;
  AppendableFile *extraout_RDX_01;
  WriteMode in_R8D;
  StringPtr name;
  StringPtr name_00;
  Maybe<kj::Own<kj::AppendableFile>_> MVar7;
  Fault f;
  Own<const_kj::Directory> local_50;
  FsNode local_40;
  Disposer local_38;
  
  lVar4 = CONCAT44(in_register_0000000c,mode);
  pAVar5 = (AppendableFile *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar4 == 1) {
    _::Mutex::lock((Mutex *)&name_00.content.ptr[1].ptr,EXCLUSIVE);
    local_50.ptr = (Directory *)(name_00.content.ptr + 3);
    pp_Var1 = (pAVar5->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x240547;
    }
    else {
      pp_Var6 = (pAVar5->super_FsNode)._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var1 + (ulong)(pp_Var1 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var6;
    local_50.disposer = (Disposer *)&name_00.content.ptr[1].ptr;
    MVar3 = Impl::openEntry((Impl *)local_50.ptr,name,in_R8D);
    if (MVar3.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      asFile((InMemoryDirectory *)&stack0xffffffffffffffc0,name_00.content.ptr,
             (EntryImpl *)&local_50,(WriteMode)MVar3.ptr);
      Maybe<kj::Own<const_kj::File>_>::map<kj::Own<kj::AppendableFile>_(&)(kj::Own<const_kj::File>)>
                ((Maybe<kj::Own<const_kj::File>_> *)this,
                 (_func_Own<kj::AppendableFile>_Own<const_kj::File> *)&stack0xffffffffffffffc0);
      Own<const_kj::File>::dispose((Own<const_kj::File> *)&stack0xffffffffffffffc0);
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&local_50);
    pAVar5 = extraout_RDX_01;
  }
  else if (lVar4 == 0) {
    if ((in_R8D & MODIFY) == 0) {
      if ((in_R8D & CREATE) != 0) {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        goto LAB_00230f4a;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4bd,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4b9,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_50);
    pAVar5 = extraout_RDX;
  }
  else {
    pp_Var1 = (pAVar5->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x240547;
    }
    else {
      pp_Var6 = (pAVar5->super_FsNode)._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var6;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc0,name_00,
                 (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    DVar2._vptr_Disposer = local_38._vptr_Disposer;
    local_50.disposer = (Disposer *)local_40._vptr_FsNode;
    local_50.ptr = (Directory *)local_38._vptr_Disposer;
    local_38._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&stack0xffffffffffffffc0);
    if ((Directory *)DVar2._vptr_Disposer == (Directory *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)((long)*DVar2._vptr_Disposer + 0x80))
                (this,DVar2._vptr_Disposer,&pAVar5[1].super_OutputStream,lVar4 + -1,in_R8D);
    }
    Own<const_kj::Directory>::dispose(&local_50);
    pAVar5 = extraout_RDX_00;
  }
LAB_00230f4a:
  MVar7.ptr.ptr = pAVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return nullptr; }
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, *entry, mode).map(newFileAppender);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryAppendFile(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }